

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O3

aom_noise_tx_t * aom_noise_tx_malloc(int block_size)

{
  ulong uVar1;
  aom_noise_tx_t *noise_tx;
  _func_void_float_ptr_float_ptr_float_ptr **pp_Var2;
  code *pcVar3;
  float *pfVar4;
  size_t size;
  
  uVar1 = (ulong)(uint)block_size;
  noise_tx = (aom_noise_tx_t *)aom_malloc(0x28);
  if (noise_tx != (aom_noise_tx_t *)0x0) {
    *(undefined8 *)&noise_tx->block_size = 0;
    noise_tx->fft = (_func_void_float_ptr_float_ptr_float_ptr *)0x0;
    noise_tx->tx_block = (float *)0x0;
    noise_tx->temp = (float *)0x0;
    noise_tx->ifft = (_func_void_float_ptr_float_ptr_float_ptr *)0x0;
    if (block_size < 8) {
      if (block_size == 2) {
        noise_tx->fft = aom_fft2x2_float_c;
        pcVar3 = aom_ifft2x2_float_c;
      }
      else {
        if (block_size != 4) {
LAB_002a37ef:
          aom_free(noise_tx);
          fprintf(_stderr,"Unsupported block size %d\n",uVar1);
          return (aom_noise_tx_t *)0x0;
        }
        noise_tx->fft = aom_fft4x4_float_sse2;
        pcVar3 = aom_ifft4x4_float_sse2;
      }
    }
    else {
      if (block_size == 8) {
        noise_tx->fft = aom_fft8x8_float;
        pp_Var2 = &aom_ifft8x8_float;
      }
      else if (block_size == 0x10) {
        noise_tx->fft = aom_fft16x16_float;
        pp_Var2 = &aom_ifft16x16_float;
      }
      else {
        if (block_size != 0x20) goto LAB_002a37ef;
        noise_tx->fft = aom_fft32x32_float;
        pp_Var2 = &aom_ifft32x32_float;
      }
      pcVar3 = *pp_Var2;
    }
    noise_tx->ifft = pcVar3;
    noise_tx->block_size = block_size;
    size = uVar1 * uVar1 * 8;
    pfVar4 = (float *)aom_memalign(0x20,size);
    noise_tx->tx_block = pfVar4;
    pfVar4 = (float *)aom_memalign(0x20,size);
    noise_tx->temp = pfVar4;
    if (pfVar4 != (float *)0x0 && noise_tx->tx_block != (float *)0x0) {
      memset(noise_tx->tx_block,0,size);
      memset(noise_tx->temp,0,size);
      return noise_tx;
    }
    aom_noise_tx_free(noise_tx);
  }
  return (aom_noise_tx_t *)0x0;
}

Assistant:

struct aom_noise_tx_t *aom_noise_tx_malloc(int block_size) {
  struct aom_noise_tx_t *noise_tx =
      (struct aom_noise_tx_t *)aom_malloc(sizeof(struct aom_noise_tx_t));
  if (!noise_tx) return NULL;
  memset(noise_tx, 0, sizeof(*noise_tx));
  switch (block_size) {
    case 2:
      noise_tx->fft = aom_fft2x2_float;
      noise_tx->ifft = aom_ifft2x2_float;
      break;
    case 4:
      noise_tx->fft = aom_fft4x4_float;
      noise_tx->ifft = aom_ifft4x4_float;
      break;
    case 8:
      noise_tx->fft = aom_fft8x8_float;
      noise_tx->ifft = aom_ifft8x8_float;
      break;
    case 16:
      noise_tx->fft = aom_fft16x16_float;
      noise_tx->ifft = aom_ifft16x16_float;
      break;
    case 32:
      noise_tx->fft = aom_fft32x32_float;
      noise_tx->ifft = aom_ifft32x32_float;
      break;
    default:
      aom_free(noise_tx);
      fprintf(stderr, "Unsupported block size %d\n", block_size);
      return NULL;
  }
  noise_tx->block_size = block_size;
  noise_tx->tx_block = (float *)aom_memalign(
      32, 2 * sizeof(*noise_tx->tx_block) * block_size * block_size);
  noise_tx->temp = (float *)aom_memalign(
      32, 2 * sizeof(*noise_tx->temp) * block_size * block_size);
  if (!noise_tx->tx_block || !noise_tx->temp) {
    aom_noise_tx_free(noise_tx);
    return NULL;
  }
  // Clear the buffers up front. Some outputs of the forward transform are
  // real only (the imaginary component will never be touched)
  memset(noise_tx->tx_block, 0,
         2 * sizeof(*noise_tx->tx_block) * block_size * block_size);
  memset(noise_tx->temp, 0,
         2 * sizeof(*noise_tx->temp) * block_size * block_size);
  return noise_tx;
}